

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64.h
# Opt level: O0

void fiat_25519_addcarryx_u51
               (uint64_t *out1,fiat_25519_uint1 *out2,fiat_25519_uint1 arg1,uint64_t arg2,
               uint64_t arg3)

{
  ulong uVar1;
  fiat_25519_uint1 x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t arg3_local;
  uint64_t arg2_local;
  fiat_25519_uint1 arg1_local;
  fiat_25519_uint1 *out2_local;
  uint64_t *out1_local;
  
  uVar1 = arg1 + arg2 + arg3;
  *out1 = uVar1 & 0x7ffffffffffff;
  *out2 = (fiat_25519_uint1)(uVar1 >> 0x33);
  return;
}

Assistant:

static FIAT_25519_FIAT_INLINE void fiat_25519_addcarryx_u51(uint64_t* out1, fiat_25519_uint1* out2, fiat_25519_uint1 arg1, uint64_t arg2, uint64_t arg3) {
  uint64_t x1;
  uint64_t x2;
  fiat_25519_uint1 x3;
  x1 = ((arg1 + arg2) + arg3);
  x2 = (x1 & UINT64_C(0x7ffffffffffff));
  x3 = (fiat_25519_uint1)(x1 >> 51);
  *out1 = x2;
  *out2 = x3;
}